

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefFuncConst(TranslateToFuzzReader *this,Type type)

{
  pointer puVar1;
  Module *module;
  undefined1 auVar2 [16];
  bool bVar3;
  char cVar4;
  Shareability SVar5;
  BasicHeapType BVar6;
  Shareability SVar7;
  uint32_t uVar8;
  RefAs *pRVar9;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar10;
  size_t *psVar11;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var12;
  Type heapType_00;
  ulong uVar13;
  long extraout_RDX;
  char *pcVar14;
  HeapType type_00;
  size_t sVar15;
  pointer puVar16;
  Name NVar17;
  Name name;
  string_view local_90;
  Type local_80;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_78;
  Shareability local_4c;
  Type local_48;
  Type type_local;
  HeapType heapType;
  TypeBuilder builder;
  
  local_48.id = type.id;
  type_local.id = (uintptr_t)Type::getHeapType(&local_48);
  SVar5 = ::wasm::HeapType::getShared();
  if (type_local.id < 0x7d) {
    BVar6 = HeapType::getBasic((HeapType *)&type_local,Unshared);
    if (BVar6 != func) {
      __assert_fail("heapType.getBasic(Unshared) == HeapType::func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xcff,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
    }
    if (((this->funcContext != (FunctionCreationContext *)0x0) &&
        (SVar7 = ::wasm::HeapType::getShared(), SVar7 == SVar5)) &&
       (bVar3 = Random::oneIn(&this->random,4), !bVar3)) {
      _Var12._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)this->funcContext->func;
LAB_0016725e:
      sVar15 = *(size_t *)
                _Var12._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar14 = *(char **)((long)_Var12._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
      heapType_00.id =
           *(undefined8 *)
            ((long)_Var12._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38);
      goto LAB_0016726c;
    }
  }
  puVar16 = (this->wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_4c = SVar5;
  if (puVar16 != puVar1) {
    uVar8 = Random::upTo(&this->random,(uint32_t)((ulong)((long)puVar1 - (long)puVar16) >> 3));
    puVar16 = (this->wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)uVar8;
    do {
      Type::Type(&local_80,
                 (HeapType)
                 *(uintptr_t *)
                  ((long)puVar16[uVar13 & 0xffffffff]._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                  + 0x38),NonNullable,Inexact);
      cVar4 = ::wasm::Type::isSubType(local_80,local_48);
      if (cVar4 != '\0') {
        _Var12._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             puVar16[uVar13 & 0xffffffff]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
        goto LAB_0016725e;
      }
      puVar16 = (this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(this->wasm->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3;
      auVar2 = ZEXT416((int)uVar13 + 1) % auVar2;
      uVar13 = auVar2._0_8_;
    } while (uVar8 != auVar2._0_4_);
  }
  SVar5 = local_4c;
  if (((((uint)local_48.id & 3) == 2 && 6 < local_48.id) &&
      (bVar3 = Random::oneIn(&this->random,2), bVar3)) ||
     (((local_48.id & 3) == 0 && 6 < local_48.id &&
      ((bVar3 = Random::oneIn(&this->random,0x10), bVar3 &&
       (this->funcContext != (FunctionCreationContext *)0x0)))))) {
    BVar6 = HeapType::getBasic((HeapType *)&HeapTypes::nofunc,SVar5);
    type_00.id._4_4_ = 0;
    type_00.id._0_4_ = BVar6;
    pRVar9 = (RefAs *)Builder::makeRefNull(&this->builder,type_00);
    if (6 < local_48.id && ((uint)local_48.id & 3) == 2) {
      return (Expression *)pRVar9;
    }
    if (this->funcContext != (FunctionCreationContext *)0x0) {
      pRVar9 = Builder::makeRefAs(&this->builder,RefAsNonNull,(Expression *)pRVar9);
      return (Expression *)pRVar9;
    }
    __assert_fail("funcContext",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xd1d,"Expression *wasm::TranslateToFuzzReader::makeRefFuncConst(Type)");
  }
  if (type_local.id < 0x7d) {
    ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&heapType,1);
    local_78._8_8_ = 0;
    local_78._0_8_ = (TypeBuilder *)&heapType;
    TypeBuilder::Entry::operator=((Entry *)&local_78._M_first,(Signature)ZEXT816(0));
    local_78._8_8_ = 0;
    local_78._0_8_ = (TypeBuilder *)&heapType;
    TypeBuilder::Entry::setShared((Entry *)&local_78._M_first,SVar5);
    ::wasm::TypeBuilder::build();
    pvVar10 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)&local_78._M_first);
    type_local.id =
         ((pvVar10->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_start)->id;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         *)&local_78._M_first);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&heapType);
  }
  ::wasm::HeapType::getSignature();
  if (extraout_RDX == 0) {
    Builder::makeNop(&this->builder);
  }
  else {
    Builder::makeUnreachable(&this->builder);
  }
  module = this->wasm;
  Name::Name((Name *)&local_90,"ref_func_target");
  NVar17 = Names::getValidFunctionName(module,(Name)local_90);
  local_78._0_8_ = (TypeBuilder *)0x0;
  local_78._8_8_ = 0;
  local_78._16_8_ = 0;
  name.super_IString.str._M_str = NVar17.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&heapType;
  Builder::makeFunction
            (name,(HeapType)NVar17.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)type_local.id,
             (Expression *)&local_78._M_first);
  psVar11 = (size_t *)::wasm::Module::addFunction((unique_ptr *)module);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&heapType);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&local_78._M_first);
  sVar15 = *psVar11;
  pcVar14 = (char *)psVar11[1];
  heapType_00 = type_local;
LAB_0016726c:
  NVar17.super_IString.str._M_str = pcVar14;
  NVar17.super_IString.str._M_len = sVar15;
  pRVar9 = (RefAs *)Builder::makeRefFunc(&this->builder,NVar17,(HeapType)heapType_00.id);
  return (Expression *)pRVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeRefFuncConst(Type type) {
  auto heapType = type.getHeapType();
  auto share = heapType.getShared();
  if (heapType.isBasic()) {
    assert(heapType.getBasic(Unshared) == HeapType::func);
    // With high probability, use the last created function if possible.
    // Otherwise, continue on to select some other function.
    if (funcContext && funcContext->func->type.getShared() == share &&
        !oneIn(4)) {
      auto* target = funcContext->func;
      return builder.makeRefFunc(target->name, target->type);
    }
  }
  // Look for a proper function starting from a random location, and loop from
  // there, wrapping around to 0.
  if (!wasm.functions.empty()) {
    Index start = upTo(wasm.functions.size());
    Index i = start;
    do {
      auto& func = wasm.functions[i];
      if (Type::isSubType(Type(func->type, NonNullable), type)) {
        return builder.makeRefFunc(func->name, func->type);
      }
      i = (i + 1) % wasm.functions.size();
    } while (i != start);
  }
  // We don't have a matching function. Create a null some of the time here,
  // but only rarely if the type is non-nullable (because in that case we'd need
  // to add a ref.as_non_null to validate, and the code will trap when we get
  // here).
  if ((type.isNullable() && oneIn(2)) ||
      (type.isNonNullable() && oneIn(16) && funcContext)) {
    Expression* ret = builder.makeRefNull(HeapTypes::nofunc.getBasic(share));
    if (!type.isNullable()) {
      assert(funcContext);
      ret = builder.makeRefAs(RefAsNonNull, ret);
    }
    return ret;
  }
  // As a final option, create a new function with the correct signature. If it
  // returns a value, write a trap as we do not want to create any more code
  // here (we might end up recursing). Note that a trap in the function lets us
  // execute more code then the ref.as_non_null path just before us, which traps
  // even if we never call the function.
  if (heapType.isBasic()) {
    // We need a specific signature type to create a function. Pick an arbitrary
    // signature if we only had generic 'func' here.
    TypeBuilder builder(1);
    builder[0] = Signature(Type::none, Type::none);
    builder[0].setShared(share);
    heapType = (*builder.build())[0];
  }
  auto* body = heapType.getSignature().results == Type::none
                 ? (Expression*)builder.makeNop()
                 : (Expression*)builder.makeUnreachable();
  auto* func = wasm.addFunction(builder.makeFunction(
    Names::getValidFunctionName(wasm, "ref_func_target"), heapType, {}, body));
  return builder.makeRefFunc(func->name, heapType);
}